

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ShapeFunctionsTimoshenko
          (ChElementBeamTaperedTimoshenko *this,ShapeFunctionGroup *NN,double eta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Matrix<double,_1,_4,_1,_1,_4> *pMVar11;
  Matrix<double,_1,_4,_1,_1,_4> *pMVar12;
  Matrix<double,_1,_4,_1,_1,_4> *pMVar13;
  Matrix<double,_1,_4,_1,_1,_4> *pMVar14;
  Matrix<double,_1,_4,_1,_1,_4> *pMVar15;
  Matrix<double,_1,_4,_1,_1,_4> *pMVar16;
  Matrix<double,_1,_4,_1,_1,_4> *pMVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ShapeFunctionGroup *pSVar28;
  Index IVar29;
  Index IVar30;
  Index IVar31;
  Index IVar32;
  Index IVar33;
  Index IVar34;
  Index IVar35;
  Index IVar36;
  Index IVar37;
  undefined8 uVar38;
  CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *pCVar39;
  ActualDstType actualDst;
  double dVar40;
  double dVar41;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  double dNx2_dx;
  double Nx2;
  SFBlock ddkNby_dx;
  SFBlock dkNsz_dx;
  SFBlock dkNby_dx;
  SFBlock dddkNbz_dx;
  SFBlock ddkNbz_dx;
  SFBlock dkNbz_dx;
  SFBlock dkNsy_dx;
  SFBlock dddkNby_dx;
  ChMatrixNM<double,_1,_2> dkNx_dx;
  ShapeFunctionN N;
  undefined1 local_6e0 [16];
  Scalar local_648;
  Matrix<double,_1,_4,_1,_1,_4> *local_640;
  double dStack_638;
  double dStack_630;
  double dStack_628;
  Matrix<double,_1,_4,_1,_1,_4> *local_620;
  double dStack_618;
  double dStack_610;
  double dStack_608;
  double local_600;
  double dStack_5f8;
  double dStack_5f0;
  double dStack_5e8;
  undefined1 local_5e0 [16];
  double dStack_5d0;
  double dStack_5c8;
  Matrix<double,_1,_4,_1,_1,_4> *local_5c0;
  double dStack_5b8;
  double dStack_5b0;
  double dStack_5a8;
  Matrix<double,_1,_4,_1,_1,_4> *local_5a0;
  double dStack_598;
  double dStack_590;
  double dStack_588;
  Matrix<double,_1,_4,_1,_1,_4> *local_580;
  double dStack_578;
  double dStack_570;
  double dStack_568;
  double local_558;
  double local_550;
  double local_548;
  double local_540;
  Matrix<double,_1,_4,_1,_1,_4> *local_538;
  Matrix<double,_1,_4,_1,_1,_4> *local_530;
  double local_528;
  ShapeFunctionGroup *local_520;
  Matrix<double,_1,_4,_1,_1,_4> *local_518;
  Scalar local_510;
  double local_508;
  undefined1 local_500 [16];
  double dStack_4f0;
  double dStack_4e8;
  undefined1 local_4e0 [16];
  double dStack_4d0;
  double dStack_4c8;
  CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> local_4c0;
  CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> local_4a0;
  CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> local_480;
  double local_450;
  undefined8 uStack_448;
  CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> local_440;
  CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> local_420;
  CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> local_400;
  CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> local_3e0;
  CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> local_3c0;
  CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> local_3a0;
  undefined8 local_370;
  double dStack_368;
  double local_360;
  double dStack_358;
  Scalar local_348;
  CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> local_340;
  CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> local_320;
  CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> local_300;
  double local_2e0;
  double dStack_2d8;
  double dStack_2d0;
  double dStack_2c8;
  Matrix<double,_6,_12,_1,_6,_12> local_2c0;
  
  local_620 = (Matrix<double,_1,_4,_1,_1,_4> *)(this->super_ChElementBeam).length;
  dVar7 = (double)local_620 * (double)local_620;
  dStack_618 = 0.0;
  local_528 = (double)local_620 * dVar7;
  local_580 = (Matrix<double,_1,_4,_1,_1,_4> *)eta;
  local_520 = NN;
  (*((this->tapered_section).
     super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr)->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[7])(&local_2c0);
  dVar40 = *(double *)
            ((long)local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.
                   m_storage.m_data.array[0] + 0x108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.
              m_data.array + 1));
  (*((this->tapered_section).
     super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr)->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[7])(&local_2c0);
  local_6e0._0_8_ =
       *(double *)
        ((long)local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.
               m_data.array[0] + 0x110);
  local_6e0._8_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.
              m_data.array + 1));
  auVar77._8_8_ = 0;
  auVar77._0_8_ = local_580;
  dVar42 = (double)local_580 * (double)local_580;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar42;
  dVar8 = dVar42 * (double)local_580;
  dVar41 = dVar40 + 1.0;
  auVar62._0_8_ = 1.0 / dVar41;
  local_5a0 = (Matrix<double,_1,_4,_1,_1,_4> *)((double)local_6e0._0_8_ + 1.0);
  dStack_598 = 0.0;
  auVar59._0_8_ = 1.0 / (double)local_5a0;
  local_600 = (1.0 - (double)local_580) * 0.5;
  dVar9 = ((double)local_580 + 1.0) * 0.5;
  local_640 = (Matrix<double,_1,_4,_1,_1,_4> *)
              ((double)local_620 * ((double)local_580 + 1.0) * -0.25);
  dStack_638 = 0.0;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar8;
  auVar18 = vfmadd213sd_fma(ZEXT816(0xc008000000000000),auVar77,auVar43);
  dVar10 = (auVar18._0_8_ + 2.0) * 0.25;
  auVar18 = vfmsub213sd_fma(ZEXT816(0x4008000000000000),auVar77,auVar43);
  local_550 = (auVar18._0_8_ + 2.0) * 0.25;
  local_5c0 = (Matrix<double,_1,_4,_1,_1,_4> *)
              ((double)local_620 * (((dVar8 - dVar42) - (double)local_580) + 1.0) * 0.125);
  auVar20 = vfmsub213sd_fma(ZEXT816(0x4000000000000000),auVar77,auVar54);
  auVar18 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar77,auVar54);
  local_540 = (double)local_620 * (((dVar42 + dVar8) - (double)local_580) + -1.0) * 0.125;
  local_548 = (double)local_620 * (auVar20._0_8_ + 3.0) * 0.125;
  local_558 = (double)local_620 * (auVar18._0_8_ + 1.0) * 0.125;
  local_508 = dVar9;
  Eigen::DenseBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_> *)&local_2c0);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar10;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = auVar62._0_8_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = auVar59._0_8_;
  auVar26._8_8_ = dStack_618;
  auVar26._0_8_ = local_620;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = local_5c0;
  auVar25._8_8_ = dStack_638;
  auVar25._0_8_ = local_640;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = local_540;
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array[0]
       = local_600;
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x27] = local_600;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = local_550;
  local_450 = -0.0;
  uStack_448 = 0x8000000000000000;
  pMVar11 = (Matrix<double,_1,_4,_1,_1,_4> *)(local_550 * auVar62._0_8_);
  pMVar12 = (Matrix<double,_1,_4,_1,_1,_4> *)(auVar59._0_8_ * local_550);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar41;
  auVar18 = vunpcklpd_avx(auVar26,auVar24);
  auVar55._8_8_ = &DAT_bff0000000000000;
  auVar55._0_8_ = &DAT_bff0000000000000;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar40;
  auVar20 = vunpcklpd_avx(auVar55,auVar23);
  local_5e0 = vdivpd_avx(auVar20,auVar18);
  local_500 = vshufpd_avx(local_5e0,local_5e0,1);
  dVar40 = local_500._0_8_;
  pMVar13 = (Matrix<double,_1,_4,_1,_1,_4> *)(local_600 * dVar40);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = pMVar13;
  auVar18 = vfmadd213sd_fma(auVar75,auVar78,auVar79);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = local_548 * dVar40;
  auVar20 = vfmadd231sd_fma(auVar80,auVar87,auVar75);
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0xd] = auVar18._0_8_;
  auVar18 = vfmadd213sd_fma(local_500,auVar25,auVar20);
  local_538 = auVar20._0_8_;
  pMVar14 = (Matrix<double,_1,_4,_1,_1,_4> *)(dVar9 * dVar40);
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x11] = auVar18._0_8_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = pMVar14;
  auVar18 = vfmadd213sd_fma(auVar75,auVar68,auVar81);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = local_558 * dVar40;
  auVar20 = vfmadd231sd_fma(auVar82,auVar88,auVar75);
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x13] = auVar18._0_8_;
  auVar18 = vfmadd213sd_fma(local_500,auVar25,auVar20);
  local_530 = auVar20._0_8_;
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x17] = auVar18._0_8_;
  pMVar15 = (Matrix<double,_1,_4,_1,_1,_4> *)((double)local_640 * dVar40);
  auVar27._8_8_ = dStack_598;
  auVar27._0_8_ = local_5a0;
  auVar18 = vunpcklpd_avx(auVar26,auVar27);
  auVar56._8_8_ = 0x3ff0000000000000;
  auVar56._0_8_ = 0x3ff0000000000000;
  auVar20 = vunpcklpd_avx(auVar56,local_6e0);
  auVar6 = vdivpd_avx(auVar20,auVar18);
  local_4e0 = vshufpd_avx(auVar6,auVar6,1);
  dVar40 = local_4e0._0_8_;
  local_5a0 = (Matrix<double,_1,_4,_1,_1,_4> *)(local_600 * dVar40);
  local_640 = (Matrix<double,_1,_4,_1,_1,_4> *)(dVar40 * -(double)local_640);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = local_548 * dVar40;
  auVar21 = vfnmsub231sd_fma(auVar83,auVar86,auVar87);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = local_558 * dVar40;
  auVar22 = vfnmsub231sd_fma(auVar76,auVar86,auVar88);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_5a0;
  auVar18 = vfmadd213sd_fma(auVar78,auVar86,auVar57);
  auVar20 = vfnmadd213sd_fma(local_4e0,auVar25,auVar21);
  local_5c0 = (Matrix<double,_1,_4,_1,_1,_4> *)(dVar9 * dVar40);
  auVar69 = vfnmadd213sd_fma(auVar25,local_4e0,auVar22);
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x1a] = auVar18._0_8_;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = local_5c0;
  auVar18 = vfmadd213sd_fma(auVar68,auVar86,auVar84);
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x1c] = auVar20._0_8_;
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x20] = auVar18._0_8_;
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x22] = auVar69._0_8_;
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array[6]
       = dVar9;
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x2d] = dVar9;
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)&local_2e0);
  local_300.m_row = 0;
  local_300.m_col = 1;
  local_300.m_currentBlockRows = 1;
  local_320.m_xpr = local_538;
  local_300.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)&local_2e0;
  local_2e0 = dVar10 * auVar62._0_8_;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (&local_300,(Scalar *)&local_320);
  local_3a0.m_xpr = pMVar11;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (pCVar39,(Scalar *)&local_3a0);
  local_480.m_xpr = local_530;
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
            (pCVar39,(Scalar *)&local_480);
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::finished(&local_300);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)&local_300);
  local_320.m_row = 0;
  local_320.m_col = 1;
  local_320.m_currentBlockRows = 1;
  local_3a0.m_xpr = pMVar15;
  local_320.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)&local_300;
  local_300.m_xpr = pMVar13;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (&local_320,(Scalar *)&local_3a0);
  local_480.m_xpr = pMVar14;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (pCVar39,(Scalar *)&local_480);
  local_3e0.m_xpr = pMVar15;
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
            (pCVar39,(Scalar *)&local_3e0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::finished(&local_320);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)&local_320);
  local_3a0.m_row = 0;
  local_3a0.m_col = 1;
  local_3a0.m_currentBlockRows = 1;
  local_480.m_xpr = auVar21._0_8_;
  local_3a0.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)&local_320;
  local_320.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)(auVar59._0_8_ * dVar10);
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (&local_3a0,(Scalar *)&local_480);
  local_3e0.m_xpr = pMVar12;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (pCVar39,(Scalar *)&local_3e0);
  local_400.m_xpr = auVar22._0_8_;
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
            (pCVar39,(Scalar *)&local_400);
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::finished(&local_3a0);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)&local_3a0);
  local_480.m_row = 0;
  local_480.m_col = 1;
  local_480.m_currentBlockRows = 1;
  local_3a0.m_xpr = local_5a0;
  local_3e0.m_xpr = local_640;
  local_480.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)&local_3a0;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (&local_480,(Scalar *)&local_3e0);
  local_400.m_xpr = local_5c0;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (pCVar39,(Scalar *)&local_400);
  local_4a0.m_xpr = local_640;
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
            (pCVar39,(Scalar *)&local_4a0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::finished(&local_480);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&local_360);
  local_480.m_row = 0;
  local_480.m_col = 1;
  local_480.m_currentBlockRows = 1;
  local_360 = local_600;
  local_480.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)&local_360;
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&local_480,&local_508);
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&local_480);
  auVar69 = ZEXT816(0x4008000000000000);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar42;
  local_510 = (Scalar)vmovlps_avx(auVar6);
  dVar40 = 1.0 / ((double)local_620 + (double)local_620);
  auVar18 = vfmadd213sd_fma(auVar69,auVar85,ZEXT816(0xc008000000000000));
  auVar20 = vfmadd213sd_fma(ZEXT816(0xc008000000000000),auVar85,auVar69);
  local_600 = auVar18._0_8_ * dVar40;
  local_620 = (Matrix<double,_1,_4,_1,_1,_4> *)(auVar20._0_8_ * dVar40);
  dStack_618 = 0.0;
  dStack_5f8 = 0.0;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = (double)local_580 + (double)local_580;
  auVar20 = vfmsub213sd_fma(auVar69,auVar85,auVar44);
  auVar18 = vfmadd213sd_fma(auVar85,auVar69,auVar44);
  dVar40 = (auVar20._0_8_ + -1.0) * 0.25;
  local_640 = (Matrix<double,_1,_4,_1,_1,_4> *)((auVar18._0_8_ + -1.0) * 0.25);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)&local_480);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = auVar62._0_8_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = pMVar13;
  local_3e0.m_row = 0;
  local_3e0.m_col = 1;
  local_3e0.m_currentBlockRows = 1;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar40;
  auVar19 = vfmadd231sd_fma(auVar70,auVar45,auVar18);
  pMVar11 = (Matrix<double,_1,_4,_1,_1,_4> *)(auVar62._0_8_ * local_600);
  local_480.m_xpr = pMVar11;
  local_400.m_xpr = auVar19._0_8_;
  local_3e0.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)&local_480;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (&local_3e0,(Scalar *)&local_400);
  pMVar12 = (Matrix<double,_1,_4,_1,_1,_4> *)((double)local_620 * auVar62._0_8_);
  local_4a0.m_xpr = pMVar12;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (pCVar39,(Scalar *)&local_4a0);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = pMVar14;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = local_640;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar62._0_8_;
  auVar20 = vfmadd231sd_fma(auVar46,auVar58,auVar20);
  local_4c0.m_xpr = auVar20._0_8_;
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
            (pCVar39,(Scalar *)&local_4c0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::finished(&local_3e0);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)&local_3e0);
  local_400.m_row = 0;
  local_400.m_col = 1;
  local_400.m_currentBlockRows = 1;
  pMVar13 = (Matrix<double,_1,_4,_1,_1,_4> *)((double)local_500._0_8_ * (double)local_5e0._0_8_);
  pMVar14 = (Matrix<double,_1,_4,_1,_1,_4> *)((double)local_500._0_8_ * -0.5);
  local_4a0.m_xpr = pMVar14;
  local_400.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)&local_3e0;
  local_3e0.m_xpr = pMVar13;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (&local_400,(Scalar *)&local_4a0);
  local_6e0._0_8_ = auVar6._0_8_;
  pMVar15 = (Matrix<double,_1,_4,_1,_1,_4> *)((double)local_500._0_8_ * (double)local_6e0._0_8_);
  local_4c0.m_xpr = pMVar15;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (pCVar39,(Scalar *)&local_4c0);
  local_420.m_xpr = pMVar14;
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
            (pCVar39,(Scalar *)&local_420);
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::finished(&local_400);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)&local_400);
  auVar59._8_8_ = 0;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar40;
  local_4a0.m_row = 0;
  local_4a0.m_col = 1;
  local_4a0.m_currentBlockRows = 1;
  local_400.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)(auVar59._0_8_ * local_600);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_5a0;
  auVar18 = vfnmsub213sd_fma(auVar59,auVar71,auVar6);
  local_4c0.m_xpr = auVar18._0_8_;
  local_4a0.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)&local_400;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (&local_4a0,(Scalar *)&local_4c0);
  local_420.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)(auVar59._0_8_ * (double)local_620);
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (pCVar39,(Scalar *)&local_420);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = auVar59._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_640;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = local_5c0;
  auVar18 = vfnmsub213sd_fma(auVar47,auVar60,auVar69);
  local_3c0.m_xpr = auVar18._0_8_;
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
            (pCVar39,(Scalar *)&local_3c0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::finished(&local_4a0);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)&local_4a0);
  local_4c0.m_row = 0;
  local_4c0.m_col = 1;
  local_4c0.m_currentBlockRows = 1;
  pMVar14 = (Matrix<double,_1,_4,_1,_1,_4> *)((double)local_4e0._0_8_ * (double)local_5e0._0_8_);
  pMVar16 = (Matrix<double,_1,_4,_1,_1,_4> *)((double)local_4e0._0_8_ * 0.5);
  local_4c0.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)&local_4a0;
  local_4a0.m_xpr = pMVar14;
  local_420.m_xpr = pMVar16;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (&local_4c0,(Scalar *)&local_420);
  pMVar17 = (Matrix<double,_1,_4,_1,_1,_4> *)((double)local_4e0._0_8_ * (double)local_6e0._0_8_);
  local_3c0.m_xpr = pMVar17;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (pCVar39,(Scalar *)&local_3c0);
  local_440.m_xpr = pMVar16;
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
            (pCVar39,(Scalar *)&local_440);
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::finished(&local_4c0);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&local_370);
  local_4c0.m_row = 0;
  local_4c0.m_col = 1;
  local_4c0.m_currentBlockRows = 1;
  local_370 = vmovlps_avx(local_5e0);
  local_4c0.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)&local_370;
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&local_4c0,&local_510);
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&local_4c0);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = auVar59._0_8_;
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x32] = auVar59._0_8_ * (double)((ulong)local_450 ^ (ulong)local_600);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar40;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_5a0;
  auVar18 = vfmadd213sd_fma(auVar48,auVar61,auVar21);
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x34] = auVar18._0_8_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = local_580;
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x38] = auVar59._0_8_ * (double)((ulong)local_450 ^ (ulong)local_620);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_640;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_5c0;
  auVar18 = vfmadd213sd_fma(auVar49,auVar61,auVar22);
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x3a] = auVar18._0_8_;
  dVar41 = ((double)local_580 * 6.0) / dVar7;
  dVar42 = ((double)local_580 * -6.0) / dVar7;
  auVar6 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),auVar72,ZEXT816(0x4008000000000000));
  auVar18 = vfmadd213sd_fma(ZEXT816(0x4008000000000000),auVar72,ZEXT816(0x3ff0000000000000));
  dVar40 = auVar18._0_8_ * (double)local_6e0._0_8_;
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x3d] = (double)pMVar11;
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x41] = (double)auVar19._0_8_;
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x43] = (double)pMVar12;
  local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>.m_storage.m_data.array
  [0x47] = (double)auVar20._0_8_;
  local_5e0._0_8_ = auVar6._0_8_ * (double)local_6e0._0_8_;
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)&local_4c0);
  auVar62._8_8_ = 0;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = pMVar13;
  local_420.m_row = 0;
  local_420.m_col = 1;
  local_420.m_currentBlockRows = 1;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_5e0._0_8_;
  auVar18 = vfmadd231sd_fma(auVar73,auVar62,auVar19);
  local_4c0.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)(auVar62._0_8_ * dVar41);
  local_3c0.m_xpr = auVar18._0_8_;
  local_420.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)&local_4c0;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (&local_420,(Scalar *)&local_3c0);
  local_440.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)(dVar42 * auVar62._0_8_);
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (pCVar39,(Scalar *)&local_440);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = pMVar15;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar40;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = auVar62._0_8_;
  auVar18 = vfmadd231sd_fma(auVar50,auVar63,auVar1);
  local_340.m_xpr = auVar18._0_8_;
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
            (pCVar39,(Scalar *)&local_340);
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::finished(&local_420);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)&local_420);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = auVar59._0_8_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = local_5e0._0_8_;
  local_3c0.m_row = 0;
  local_3c0.m_col = 1;
  local_3c0.m_currentBlockRows = 1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = pMVar14;
  auVar18 = vfnmsub213sd_fma(auVar74,auVar64,auVar2);
  local_420.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)(auVar59._0_8_ * dVar41);
  local_440.m_xpr = auVar18._0_8_;
  local_3c0.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)&local_420;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (&local_3c0,(Scalar *)&local_440);
  local_340.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)(dVar42 * auVar59._0_8_);
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (pCVar39,(Scalar *)&local_340);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = auVar59._0_8_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar40;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = pMVar17;
  auVar18 = vfnmsub213sd_fma(auVar65,auVar51,auVar3);
  local_648 = auVar18._0_8_;
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_(pCVar39,&local_648);
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::finished(&local_3c0);
  dVar40 = 12.0 / local_528;
  dVar41 = -12.0 / local_528;
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)&local_3c0);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = auVar62._0_8_;
  local_440.m_row = 0;
  local_440.m_col = 1;
  local_440.m_currentBlockRows = 1;
  local_3c0.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)(auVar62._0_8_ * dVar40);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = 6.0 / dVar7;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = (double)local_500._0_8_ * 0.0;
  auVar18 = vfmadd231sd_fma(auVar52,auVar66,auVar4);
  local_580 = auVar18._0_8_;
  local_440.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)&local_3c0;
  local_340.m_xpr = local_580;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (&local_440,(Scalar *)&local_340);
  local_648 = auVar62._0_8_ * dVar41;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (pCVar39,&local_648);
  local_518 = local_580;
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
            (pCVar39,(Scalar *)&local_518);
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::finished(&local_440);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)&local_440);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = auVar59._0_8_;
  local_340.m_row = 0;
  local_440.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)(auVar59._0_8_ * dVar40);
  local_340.m_col = 1;
  local_340.m_currentBlockRows = 1;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = 6.0 / dVar7;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_450 * (double)local_4e0._0_8_;
  auVar18 = vfnmadd231sd_fma(auVar53,auVar67,auVar5);
  local_648 = auVar18._0_8_;
  local_340.m_xpr = (Matrix<double,_1,_4,_1,_1,_4> *)&local_440;
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (&local_340,&local_648);
  local_518 = (Matrix<double,_1,_4,_1,_1,_4> *)(auVar59._0_8_ * dVar41);
  pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_
                      (pCVar39,(Scalar *)&local_518);
  local_348 = auVar18._0_8_;
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::operator_(pCVar39,&local_348);
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::finished(&local_340);
  dVar40 = local_360;
  uVar38 = local_370;
  IVar37 = local_3a0.m_currentBlockRows;
  IVar36 = local_3a0.m_col;
  IVar35 = local_3a0.m_row;
  pMVar13 = local_3a0.m_xpr;
  IVar34 = local_420.m_currentBlockRows;
  IVar33 = local_420.m_col;
  IVar32 = local_420.m_row;
  pMVar12 = local_420.m_xpr;
  IVar31 = local_4a0.m_currentBlockRows;
  IVar30 = local_4a0.m_col;
  IVar29 = local_4a0.m_row;
  pMVar11 = local_4a0.m_xpr;
  pSVar28 = local_520;
  local_5e0._0_8_ = local_320.m_xpr;
  local_5e0._8_8_ = local_320.m_row;
  dStack_5d0 = (double)local_320.m_col;
  dStack_5c8 = (double)local_320.m_currentBlockRows;
  local_500._0_8_ = local_300.m_xpr;
  local_500._8_8_ = local_300.m_row;
  dStack_4f0 = (double)local_300.m_col;
  dStack_4e8 = (double)local_300.m_currentBlockRows;
  local_600 = local_2e0;
  dStack_5f8 = dStack_2d8;
  dStack_5f0 = dStack_2d0;
  dStack_5e8 = dStack_2c8;
  local_5a0 = local_400.m_xpr;
  dStack_598 = (double)local_400.m_row;
  dStack_590 = (double)local_400.m_col;
  dStack_588 = (double)local_400.m_currentBlockRows;
  local_620 = local_3e0.m_xpr;
  dStack_618 = (double)local_3e0.m_row;
  dStack_610 = (double)local_3e0.m_col;
  dStack_608 = (double)local_3e0.m_currentBlockRows;
  local_640 = local_480.m_xpr;
  dStack_638 = (double)local_480.m_row;
  dStack_630 = (double)local_480.m_col;
  dStack_628 = (double)local_480.m_currentBlockRows;
  local_5c0 = local_4c0.m_xpr;
  dStack_5b8 = (double)local_4c0.m_row;
  dStack_5b0 = (double)local_4c0.m_col;
  dStack_5a8 = (double)local_4c0.m_currentBlockRows;
  local_580 = local_440.m_xpr;
  dStack_578 = (double)local_440.m_row;
  dStack_570 = (double)local_440.m_col;
  dStack_568 = (double)local_440.m_currentBlockRows;
  local_4e0._0_8_ = local_3c0.m_xpr;
  local_4e0._8_8_ = local_3c0.m_row;
  dStack_4d0 = (double)local_3c0.m_col;
  dStack_4c8 = (double)local_3c0.m_currentBlockRows;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,6,12,1,6,12>,Eigen::Matrix<double,6,12,1,6,12>>
            (&(local_520->
              super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              ).super__Head_base<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_false>._M_head_impl,
             &local_2c0);
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0] = local_600
  ;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[1] =
       dStack_5f8;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] =
       dStack_5f0;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3] =
       dStack_5e8;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0] =
       (double)local_500._0_8_;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[1] =
       (double)local_500._8_8_;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] =
       dStack_4f0;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3] =
       dStack_4e8;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0] =
       (double)local_5e0._0_8_;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[1] =
       (double)local_5e0._8_8_;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] =
       dStack_5d0;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3] =
       dStack_5c8;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0] =
       (double)pMVar13;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[1] =
       (double)IVar35;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] =
       (double)IVar36;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3] =
       (double)IVar37;
  *(double *)
   &(pSVar28->
    super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    ).
    super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
    ._M_head_impl.
    super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
    .
    super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
    .
    super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
    .
    super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
    .super__Tuple_impl<4UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
    super__Head_base<4UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_false> = dVar40;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Tuple_impl<4UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
  super__Head_base<4UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1] =
       dStack_358;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0] =
       (double)local_640;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[1] =
       dStack_638;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] =
       dStack_630;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3] =
       dStack_628;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0] =
       (double)local_620;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[1] =
       dStack_618;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] =
       dStack_610;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3] =
       dStack_608;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0] =
       (double)local_5a0;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[1] =
       dStack_598;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] =
       dStack_590;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3] =
       dStack_588;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0] =
       (double)pMVar11;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[1] =
       (double)IVar29;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] =
       (double)IVar30;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Head_base<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3] =
       (double)IVar31;
  *(undefined8 *)
   &(pSVar28->
    super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    ).
    super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
    ._M_head_impl.
    super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
    .
    super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
    .
    super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
    .
    super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
    .super__Tuple_impl<4UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
    super__Head_base<4UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_false> = uVar38;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .
  super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  .super__Tuple_impl<4UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
  super__Head_base<4UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1] =
       dStack_368;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0] =
       (double)local_5c0;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[1] =
       dStack_5b8;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] =
       dStack_5b0;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3] =
       dStack_5a8;
  *(Matrix<double,_1,_4,_1,_1,_4> **)
   &(pSVar28->
    super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    ).
    super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Head_base<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
    ._M_head_impl.
    super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
    .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
    super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
    super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage = pMVar12;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
  super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[1] =
       (double)IVar32;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
  super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] =
       (double)IVar33;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
  super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3] =
       (double)IVar34;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0] =
       (double)local_4e0._0_8_;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[1] =
       (double)local_4e0._8_8_;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] =
       dStack_4d0;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3] =
       dStack_4c8;
  *(Matrix<double,_1,_4,_1,_1,_4> **)
   &(pSVar28->
    super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    ).
    super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
    ._M_head_impl = local_580;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
  super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[1] =
       dStack_578;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
  super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] =
       dStack_570;
  (pSVar28->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ).
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
  super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3] =
       dStack_568;
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenko::ShapeFunctionsTimoshenko(ShapeFunctionGroup& NN, double eta) {
    // eta = 2 * x/L;
    // x = (-L/2, L/2),  hence eta = (-1, 1)

    double L = this->length;
    double LL = L * L;
    double LLL = LL * L;
    double phiy = this->tapered_section->GetAverageSectionParameters()->phiy;
    double phiz = this->tapered_section->GetAverageSectionParameters()->phiz;

    double eta2 = eta * eta;
    double eta3 = eta2 * eta;

    double ay = 1. / (1. + phiy);
    double by = phiy / (1. + phiy);
    double az = 1. / (1. + phiz);
    double bz = phiz / (1. + phiz);

    // axial, torsion
    double Nx1 = 1. / 2. * (1 - eta);
    double Nx2 = 1. / 2. * (1 + eta);
    // shear
    double Nsu1 = 1. / 2. * (1 - eta);
    double Nsu2 = 1. / 2. * (1 + eta);
    double Nsr = -1. / 4. * (1 + eta) * L;
    // bending
    double Nbu1 = 1. / 4. * (eta3 - 3. * eta + 2.);
    double Nbu2 = 1. / 4. * (-eta3 + 3. * eta + 2.);
    double Nbr1 = 1. / 8. * (eta3 - eta2 - eta + 1.) * L;
    double Nbr2 = 1. / 8. * (-eta2 + 2. * eta + 3.) * L;
    double Nbr3 = 1. / 8. * (eta3 + eta2 - eta - 1.) * L;
    double Nbr4 = 1. / 8. * (eta2 + 2. * eta + 1.) * L;

    // shape functions, reduced from three-dimensional shape functions.
    // hence, only valid for the points at centerline
    ShapeFunctionN N;
    N.setZero();
    // x
    N(0, 0) = Nx1;
    N(0, 6) = Nx2;
    // y
    N(1, 1) = Nbu1 * ay + Nsu1 * by;
    N(1, 5) = Nbr1 * ay + Nbr2 * by + Nsr * by;
    N(1, 7) = Nbu2 * ay + Nsu2 * by;
    N(1, 11) = Nbr3 * ay + Nbr4 * by + Nsr * by;
    // z
    N(2, 2) = Nbu1 * az + Nsu1 * bz;
    N(2, 4) = -Nbr1 * az - Nbr2 * bz - Nsr * bz;
    N(2, 8) = Nbu2 * az + Nsu2 * bz;
    N(2, 10) = -Nbr3 * az - Nbr4 * bz - Nsr * bz;
    // rotx
    N(3, 3) = Nx1;
    N(3, 9) = Nx2;

    // Variables named with initial 'k' means block of shape function matrix
    // Variables named with initial 'd' means derivatives respect to x
    // 'd'   --> first derivative
    // 'dd'  --> second derivative
    // 'ddd' --> third derivative

    // some important blocks from shape function matrix
    // bending y
    SFBlock kNby;
    kNby.setZero();
    kNby << Nbu1 * ay, Nbr1 * ay + Nbr2 * by, Nbu2 * ay, Nbr3 * ay + Nbr4 * by;
    // shear y
    SFBlock kNsy;
    kNsy.setZero();
    kNsy << Nsu1 * by, Nsr * by, Nsu2 * by, Nsr * by;
    // bending z
    SFBlock kNbz;
    kNbz.setZero();
    kNbz << Nbu1 * az, -Nbr1 * az - Nbr2 * bz, Nbu2 * az, -Nbr3 * az - Nbr4 * bz;
    // shear z
    SFBlock kNsz;
    kNsz.setZero();
    kNsz << Nsu1 * bz, -Nsr * bz, Nsu2 * bz, -Nsr * bz;
    // axial, torsion
    ChMatrixNM<double, 1, 2> kNx;
    kNx.setZero();
    kNx << Nx1, Nx2;

    // first derivatives
    double dNx1_dx = -1. / L;
    double dNx2_dx = 1. / L;
    double dNsu1_dx = -1. / L;
    double dNsu2_dx = 1. / L;
    double dNsr_dx = -1. / 2.;

    double dNbu1_dx = 1. / (2. * L) * (3. * eta2 - 3.);
    double dNbu2_dx = 1. / (2. * L) * (-3. * eta2 + 3.);

    double dNbr1_dx = 1. / 4. * (3. * eta2 - 2. * eta - 1.);
    double dNbr2_dx = 1. / 2. * (1. - eta);
    double dNbr3_dx = 1. / 4. * (3. * eta2 + 2. * eta - 1.);
    double dNbr4_dx = 1. / 2. * (1. + eta);

    SFBlock dkNby_dx;
    dkNby_dx.setZero();
    dkNby_dx << dNbu1_dx * ay, dNbr1_dx * ay + dNbr2_dx * by, dNbu2_dx * ay, dNbr3_dx * ay + dNbr4_dx * by;

    SFBlock dkNsy_dx;
    dkNsy_dx.setZero();
    dkNsy_dx << dNsu1_dx * by, dNsr_dx * by, dNsu2_dx * by, dNsr_dx * by;

    SFBlock dkNbz_dx;
    dkNbz_dx.setZero();
    dkNbz_dx << dNbu1_dx * az, -dNbr1_dx * az - dNbr2_dx * bz, dNbu2_dx * az, -dNbr3_dx * az - dNbr4_dx * bz;

    SFBlock dkNsz_dx;
    dkNsz_dx.setZero();
    dkNsz_dx << dNsu1_dx * bz, -dNsr_dx * bz, dNsu2_dx * bz, -dNsr_dx * bz;

    ChMatrixNM<double, 1, 2> dkNx_dx;
    dkNx_dx.setZero();
    dkNx_dx << dNx1_dx, dNx2_dx;

    // Continue to fill in the shape functions to finish it.
    // roty
    N(4, 2) = -dNbu1_dx * az;                  // - dNsu1_dx * bz;
    N(4, 4) = dNbr1_dx * az + dNbr2_dx * bz;   // + dNsr_dx  * bz;
    N(4, 8) = -dNbu2_dx * az;                  // - dNsu2_dx * bz;
    N(4, 10) = dNbr3_dx * az + dNbr4_dx * bz;  // + dNsr_dx  * bz;
    // rotz
    N(5, 1) = dNbu1_dx * ay;                   // + dNsu1_dx * by;
    N(5, 5) = dNbr1_dx * ay + dNbr2_dx * by;   // + dNsr_dx  * by;
    N(5, 7) = dNbu2_dx * ay;                   // + dNsu2_dx * by;
    N(5, 11) = dNbr3_dx * ay + dNbr4_dx * by;  // + dNsr_dx  * by;

    // Second derivatives
    double ddNbu1_dx = 6. * eta / LL;
    double ddNbu2_dx = -6. * eta / LL;

    double ddNbr1_dx = 1. / L * (3. * eta - 1.);
    double ddNbr2_dx = -1. / L;
    double ddNbr3_dx = 1. / L * (3. * eta + 1.);
    double ddNbr4_dx = 1. / L;

    SFBlock ddkNby_dx;
    ddkNby_dx.setZero();
    ddkNby_dx << ddNbu1_dx * ay, ddNbr1_dx * ay + ddNbr2_dx * by, ddNbu2_dx * ay, ddNbr3_dx * ay + ddNbr4_dx * by;

    SFBlock ddkNbz_dx;
    ddkNbz_dx.setZero();
    ddkNbz_dx << ddNbu1_dx * az, -ddNbr1_dx * az - ddNbr2_dx * bz, ddNbu2_dx * az, -ddNbr3_dx * az - ddNbr4_dx * bz;

    // Third derivatives
    double dddNbu1_dx = 12. / LLL;
    double dddNbu2_dx = -12. / LLL;

    double dddNbr1_dx = 6. / LL;
    double dddNbr2_dx = 0.;
    double dddNbr3_dx = 6. / LL;
    double dddNbr4_dx = 0.;

    SFBlock dddkNby_dx;
    dddkNby_dx.setZero();
    dddkNby_dx << dddNbu1_dx * ay, dddNbr1_dx * ay + dddNbr2_dx * by, dddNbu2_dx * ay,
        dddNbr3_dx * ay + dddNbr4_dx * by;

    SFBlock dddkNbz_dx;
    dddkNbz_dx.setZero();
    dddkNbz_dx << dddNbu1_dx * az, -dddNbr1_dx * az - dddNbr2_dx * bz, dddNbu2_dx * az,
        -dddNbr3_dx * az - dddNbr4_dx * bz;

    ShapeFunction5Blocks SFblk = std::make_tuple(kNby, kNsy, kNbz, kNsz, kNx);
    ShapeFunction5Blocks SFblk1d = std::make_tuple(dkNby_dx, dkNsy_dx, dkNbz_dx, dkNsz_dx, dkNx_dx);
    ShapeFunction2Blocks SFblk2d = std::make_tuple(ddkNby_dx, ddkNbz_dx);
    ShapeFunction2Blocks SFblk3d = std::make_tuple(dddkNby_dx, dddkNbz_dx);

    std::get<0>(NN) = N;
    std::get<1>(NN) = SFblk;
    std::get<2>(NN) = SFblk1d;
    std::get<3>(NN) = SFblk2d;
    std::get<4>(NN) = SFblk3d;
}